

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

bool __thiscall DistanceGraph::remove_link(DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  vector<Link,_std::allocator<Link>_> *this_00;
  vector<Link,_std::allocator<Link>_> *this_01;
  pointer pvVar1;
  sgNodeID_t sVar2;
  sgNodeID_t sVar3;
  undefined4 uVar4;
  SupportType SVar5;
  undefined1 uVar6;
  uint16_t uVar7;
  undefined4 uVar8;
  long lVar9;
  const_iterator cVar10;
  long lVar11;
  long lVar12;
  const_iterator cVar13;
  Link *pLVar14;
  Link *pLVar15;
  long lVar16;
  bool bVar17;
  
  lVar11 = -source;
  if (0 < source) {
    lVar11 = source;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pvVar1 + lVar11;
  pLVar14 = pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
            super__Vector_impl_data._M_start;
  cVar10._M_current =
       *(pointer *)
        ((long)&pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data + 8);
  lVar16 = (long)cVar10._M_current - (long)pLVar14;
  lVar11 = lVar16;
  for (lVar9 = lVar16 / 0x28 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
    if ((pLVar14->source == source) && (cVar13._M_current = pLVar14, pLVar14->dest == dest))
    goto LAB_001c675b;
    if ((pLVar14[1].source == source) && (pLVar14[1].dest == dest)) {
      cVar13._M_current = pLVar14 + 1;
      goto LAB_001c675b;
    }
    if ((pLVar14[2].source == source) && (pLVar14[2].dest == dest)) {
      cVar13._M_current = pLVar14 + 2;
      goto LAB_001c675b;
    }
    if ((pLVar14[3].source == source) && (pLVar14[3].dest == dest)) {
      cVar13._M_current = pLVar14 + 3;
      goto LAB_001c675b;
    }
    pLVar14 = pLVar14 + 4;
    lVar11 = lVar11 + -0xa0;
  }
  lVar11 = lVar11 / 0x28;
  if (lVar11 == 1) {
LAB_001c6735:
    cVar13._M_current = pLVar14;
    if (pLVar14->dest != dest || pLVar14->source != source) {
      cVar13._M_current = cVar10._M_current;
    }
LAB_001c675b:
    pLVar14 = cVar13._M_current;
    if (cVar13._M_current != cVar10._M_current) {
      while (pLVar15 = pLVar14, pLVar14 = pLVar15 + 1, pLVar14 != cVar10._M_current) {
        if ((pLVar14->source != source) || (pLVar15[1].dest != dest)) {
          ((cVar13._M_current)->support).id = pLVar15[1].support.id;
          sVar2 = pLVar14->source;
          sVar3 = pLVar15[1].dest;
          uVar4 = *(undefined4 *)&pLVar15[1].field_0x14;
          SVar5 = pLVar15[1].support.type;
          uVar6 = pLVar15[1].support.field_0x1;
          uVar7 = pLVar15[1].support.index;
          uVar8 = *(undefined4 *)&pLVar15[1].support.field_0x4;
          (cVar13._M_current)->dist = pLVar15[1].dist;
          *(undefined4 *)&(cVar13._M_current)->field_0x14 = uVar4;
          ((cVar13._M_current)->support).type = SVar5;
          ((cVar13._M_current)->support).field_0x1 = uVar6;
          ((cVar13._M_current)->support).index = uVar7;
          *(undefined4 *)&((cVar13._M_current)->support).field_0x4 = uVar8;
          (cVar13._M_current)->source = sVar2;
          (cVar13._M_current)->dest = sVar3;
          cVar13._M_current = cVar13._M_current + 1;
        }
      }
      cVar10._M_current =
           (this_00->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
  }
  else {
    if (lVar11 == 2) {
LAB_001c6726:
      if ((pLVar14->source != source) || (cVar13._M_current = pLVar14, pLVar14->dest != dest)) {
        pLVar14 = pLVar14 + 1;
        goto LAB_001c6735;
      }
      goto LAB_001c675b;
    }
    cVar13._M_current = cVar10._M_current;
    if (lVar11 == 3) {
      if ((pLVar14->source != source) || (cVar13._M_current = pLVar14, pLVar14->dest != dest)) {
        pLVar14 = pLVar14 + 1;
        goto LAB_001c6726;
      }
      goto LAB_001c675b;
    }
  }
  std::vector<Link,_std::allocator<Link>_>::erase(this_00,cVar13,cVar10);
  lVar11 = -dest;
  if (0 < dest) {
    lVar11 = dest;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01 = pvVar1 + lVar11;
  pLVar14 = pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
            super__Vector_impl_data._M_start;
  cVar10._M_current =
       *(pointer *)
        ((long)&pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data + 8);
  lVar12 = (long)cVar10._M_current - (long)pLVar14;
  lVar11 = lVar12;
  for (lVar9 = lVar12 / 0x28 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
    if ((pLVar14->source == dest) && (cVar13._M_current = pLVar14, pLVar14->dest == source))
    goto LAB_001c689c;
    if ((pLVar14[1].source == dest) && (pLVar14[1].dest == source)) {
      cVar13._M_current = pLVar14 + 1;
      goto LAB_001c689c;
    }
    if ((pLVar14[2].source == dest) && (pLVar14[2].dest == source)) {
      cVar13._M_current = pLVar14 + 2;
      goto LAB_001c689c;
    }
    if ((pLVar14[3].source == dest) && (pLVar14[3].dest == source)) {
      cVar13._M_current = pLVar14 + 3;
      goto LAB_001c689c;
    }
    pLVar14 = pLVar14 + 4;
    lVar11 = lVar11 + -0xa0;
  }
  lVar11 = lVar11 / 0x28;
  if (lVar11 == 1) {
LAB_001c6876:
    cVar13._M_current = pLVar14;
    if (pLVar14->dest != source || pLVar14->source != dest) {
      cVar13._M_current = cVar10._M_current;
    }
  }
  else if (lVar11 == 2) {
LAB_001c6867:
    if ((pLVar14->source != dest) || (cVar13._M_current = pLVar14, pLVar14->dest != source)) {
      pLVar14 = pLVar14 + 1;
      goto LAB_001c6876;
    }
  }
  else {
    cVar13._M_current = cVar10._M_current;
    if (lVar11 != 3) goto LAB_001c68e9;
    if ((pLVar14->source != dest) || (cVar13._M_current = pLVar14, pLVar14->dest != source)) {
      pLVar14 = pLVar14 + 1;
      goto LAB_001c6867;
    }
  }
LAB_001c689c:
  pLVar14 = cVar13._M_current;
  if (cVar13._M_current != cVar10._M_current) {
    while (pLVar15 = pLVar14, pLVar14 = pLVar15 + 1, pLVar14 != cVar10._M_current) {
      if ((pLVar14->source != dest) || (pLVar15[1].dest != source)) {
        ((cVar13._M_current)->support).id = pLVar15[1].support.id;
        sVar2 = pLVar14->source;
        sVar3 = pLVar15[1].dest;
        uVar4 = *(undefined4 *)&pLVar15[1].field_0x14;
        SVar5 = pLVar15[1].support.type;
        uVar6 = pLVar15[1].support.field_0x1;
        uVar7 = pLVar15[1].support.index;
        uVar8 = *(undefined4 *)&pLVar15[1].support.field_0x4;
        (cVar13._M_current)->dist = pLVar15[1].dist;
        *(undefined4 *)&(cVar13._M_current)->field_0x14 = uVar4;
        ((cVar13._M_current)->support).type = SVar5;
        ((cVar13._M_current)->support).field_0x1 = uVar6;
        ((cVar13._M_current)->support).index = uVar7;
        *(undefined4 *)&((cVar13._M_current)->support).field_0x4 = uVar8;
        (cVar13._M_current)->source = sVar2;
        (cVar13._M_current)->dest = sVar3;
        cVar13._M_current = cVar13._M_current + 1;
      }
    }
    cVar10._M_current =
         (this_01->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  }
LAB_001c68e9:
  std::vector<Link,_std::allocator<Link>_>::erase(this_01,cVar13,cVar10);
  bVar17 = true;
  if ((long)(this_00->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this_00->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
            super__Vector_impl_data._M_start == lVar16) {
    bVar17 = (long)(this_01->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this_01->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                   super__Vector_impl_data._M_start != lVar12;
  }
  return bVar17;
}

Assistant:

bool DistanceGraph::remove_link(sgNodeID_t source, sgNodeID_t dest) {
    auto & slinks = links[(source > 0 ? source : -source)];
    auto slinksLen = slinks.size();
    slinks.erase(std::remove_if(slinks.begin(), slinks.end(), [source,dest] (auto l) {return l.source==source and l.dest==dest;}), slinks.end());
    auto & dlinks = links[(dest > 0 ? dest : -dest)];
    auto dlinksLen = dlinks.size();
    dlinks.erase(std::remove_if(dlinks.begin(), dlinks.end(), [source,dest] (auto l) {return l.source==dest and l.dest==source;}), dlinks.end());
    if (slinks.size() != slinksLen or dlinks.size() != dlinksLen) return true;
    return false;
}